

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O0

int linenoiseHistorySave(char *filename)

{
  FILE *__stream;
  int local_24;
  int j;
  FILE *fp;
  char *filename_local;
  
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    filename_local._4_4_ = -1;
  }
  else {
    for (local_24 = 0; local_24 < history_len; local_24 = local_24 + 1) {
      fprintf(__stream,"%s\n",history[local_24]);
    }
    fclose(__stream);
    filename_local._4_4_ = 0;
  }
  return filename_local._4_4_;
}

Assistant:

int linenoiseHistorySave(const char *filename) {
    FILE *fp = fopen(filename,"w");
    int j;

    if (fp == NULL) return -1;
    for (j = 0; j < history_len; j++)
        fprintf(fp,"%s\n",history[j]);
    fclose(fp);
    return 0;
}